

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createIntrinsic(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  ID IVar2;
  PSNode *pPVar3;
  LLVMPointerGraphBuilder *in_RSI;
  PSNode *in_RDI;
  IntrinsicInst *I;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  PSNode *Inst_00;
  initializer_list<dg::pta::PSNode_*> *in_stack_ffffffffffffff98;
  PSNodesSeq *in_stack_ffffffffffffffa0;
  IntrinsicInst *in_stack_ffffffffffffffb8;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffc0;
  Instruction *in_stack_ffffffffffffffd0;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffd8;
  LLVMPointerGraphBuilder *Inst_01;
  
  Inst_00 = in_RDI;
  Inst_01 = in_RSI;
  pPVar3 = in_RDI;
  llvm::cast<llvm::IntrinsicInst,llvm::Instruction_const>((Instruction *)0x1bae1a);
  bVar1 = llvm::isa<llvm::MemTransferInst,llvm::IntrinsicInst_const*>((IntrinsicInst **)0x1bae29);
  if (bVar1) {
    createMemTransfer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    PSNodesSeq::PSNodesSeq
              ((PSNodesSeq *)in_RDI,
               (PSNode *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    bVar1 = llvm::isa<llvm::MemSetInst,llvm::IntrinsicInst_const*>((IntrinsicInst **)0x1bae5a);
    if (bVar1) {
      createMemSet(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
    else {
      IVar2 = llvm::IntrinsicInst::getIntrinsicID((IntrinsicInst *)0x1bae83);
      if (IVar2 == 0xa4) {
        pPVar3 = createLifetimeEnd(in_RSI,(Instruction *)Inst_00);
        PSNodesSeq::PSNodesSeq
                  ((PSNodesSeq *)&stack0xffffffffffffff98,
                   (initializer_list<dg::pta::PSNode_*> *)pPVar3);
      }
      else if (IVar2 == 0x119) {
        createInternalLoad((LLVMPointerGraphBuilder *)in_stack_ffffffffffffffa0,
                           (Instruction *)in_stack_ffffffffffffff98);
        PSNodesSeq::PSNodesSeq(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else if (IVar2 == 0x11a) {
        llvm::errs();
        llvm::raw_ostream::operator<<((raw_ostream *)in_RSI,(char *)Inst_00);
        llvm::operator<<((raw_ostream *)in_RDI,(Value *)CONCAT44(IVar2,in_stack_ffffffffffffff78));
        llvm::raw_ostream::operator<<((raw_ostream *)in_RSI,(char *)Inst_00);
        PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)in_RDI);
        PSNodeAlloc::get<dg::pta::PSNode>(in_RDI);
        PSNodesSeq::PSNodesSeq(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        if (IVar2 != 0x134) {
          llvm::errs();
          llvm::operator<<((raw_ostream *)in_RDI,(Value *)CONCAT44(IVar2,in_stack_ffffffffffffff78))
          ;
          llvm::raw_ostream::operator<<((raw_ostream *)in_RSI,(char *)Inst_00);
          llvm::errs();
          llvm::raw_ostream::operator<<((raw_ostream *)in_RSI,(char *)Inst_00);
          abort();
        }
        createVarArg((LLVMPointerGraphBuilder *)pPVar3,(IntrinsicInst *)Inst_01);
      }
    }
  }
  return (PSNodesSeq *)Inst_00;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createIntrinsic(const llvm::Instruction *Inst) {
    using namespace llvm;

    const IntrinsicInst *I = cast<IntrinsicInst>(Inst);
    if (isa<MemTransferInst>(I)) {
        return createMemTransfer(I);
    }
    if (isa<MemSetInst>(I)) {
        return createMemSet(I);
    }

    switch (I->getIntrinsicID()) {
    case Intrinsic::vastart:
        return createVarArg(I);
    case Intrinsic::stacksave:
        errs() << "WARNING: Saving stack may yield unsound results!: " << *Inst
               << "\n";
        return {PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>())};
    case Intrinsic::stackrestore:
        return {createInternalLoad(Inst)};
    case Intrinsic::lifetime_end:
        return {createLifetimeEnd(Inst)};
    default:
        errs() << *Inst << "\n";
        errs() << "Unhandled intrinsic ^^\n";
        abort();
    }
}